

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O3

void __thiscall Nibbler::Nibbler(Nibbler *this,Nibbler *other)

{
  pointer pcVar1;
  size_type sVar2;
  
  (this->_input)._M_dataplus._M_p = (pointer)&(this->_input).field_2;
  pcVar1 = (other->_input)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (other->_input)._M_string_length);
  sVar2 = other->_cursor;
  this->_length = other->_length;
  this->_cursor = sVar2;
  return;
}

Assistant:

Nibbler::Nibbler (const Nibbler& other)
: _input (other._input)
, _length (other._length)
, _cursor (other._cursor)
{
}